

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O2

uint8_t * __thiscall
cdns_query_signature::parse_map_item
          (cdns_query_signature *this,uint8_t *in,uint8_t *in_max,int64_t val,int *err)

{
  cdns *pcVar1;
  uint8_t *puVar2;
  int *v;
  
  pcVar1 = this->current_block->current_cdns;
  if ((pcVar1->preamble_parsed == true) && ((pcVar1->preamble).cdns_version_major == 0)) {
    puVar2 = parse_map_item_old(this,in,in_max,val,err);
    return puVar2;
  }
  switch(val) {
  case 0:
    v = &this->server_address_index;
    break;
  case 1:
    v = &this->server_port;
    break;
  case 2:
    v = &this->qr_transport_flags;
    break;
  case 3:
    v = &this->qr_type;
    break;
  case 4:
    v = &this->qr_sig_flags;
    break;
  case 5:
    v = &this->query_opcode;
    break;
  case 6:
    v = &this->qr_dns_flags;
    break;
  case 7:
    v = &this->query_rcode;
    break;
  case 8:
    v = &this->query_classtype_index;
    break;
  case 9:
    v = &this->query_qd_count;
    break;
  case 10:
    v = &this->query_an_count;
    break;
  case 0xb:
    v = &this->query_ns_count;
    break;
  case 0xc:
    v = &this->query_ar_count;
    break;
  case 0xd:
    v = &this->edns_version;
    break;
  case 0xe:
    v = &this->udp_buf_size;
    break;
  case 0xf:
    v = &this->opt_rdata_index;
    break;
  case 0x10:
    v = &this->response_rcode;
    break;
  default:
    puVar2 = cbor_skip(in,in_max,err);
    return puVar2;
  }
  puVar2 = cbor_parse_int(in,in_max,v,0,err);
  return puVar2;
}

Assistant:

uint8_t* cdns_query_signature::parse_map_item(uint8_t* in, uint8_t const* in_max, int64_t val, int* err)
{
    if (current_block->current_cdns->is_old_version()) {
        in = parse_map_item_old(in, in_max, val, err);
    }
    else {
        switch (val) {
        case 0: /*  server_address_index */
            in = cbor_parse_int(in, in_max, &server_address_index, 0, err);
            break;
        case 1: /*  server_port */
            in = cbor_parse_int(in, in_max, &server_port, 0, err);
            break;
        case 2: /*  transport_flags */
            in = cbor_parse_int(in, in_max, &qr_transport_flags, 0, err);
            break;
        case 3: /* qr type */
            in = cbor_parse_int(in, in_max, &qr_type, 0, err);
            break;
        case 4: /*  qr_sig_flags */
            in = cbor_parse_int(in, in_max, &qr_sig_flags, 0, err);
            break;
        case 5: /*  query_opcode */
            in = cbor_parse_int(in, in_max, &query_opcode, 0, err);
            break;
        case 6: /*  qr_dns_flags */
            in = cbor_parse_int(in, in_max, &qr_dns_flags, 0, err);
            break;
        case 7: /*  query_rcode */
            in = cbor_parse_int(in, in_max, &query_rcode, 0, err);
            break;
        case 8: /*  query_classtype_index */
            in = cbor_parse_int(in, in_max, &query_classtype_index, 0, err);
            break;
        case 9: /*  query_qd_count */
            in = cbor_parse_int(in, in_max, &query_qd_count, 0, err);
            break;
        case 10: /*  query_an_count */
            in = cbor_parse_int(in, in_max, &query_an_count, 0, err);
            break;
        case 11: /*  query_ns_count */
            in = cbor_parse_int(in, in_max, &query_ns_count, 0, err);
            break;
        case 12: /*  query_ar_count */
            in = cbor_parse_int(in, in_max, &query_ar_count, 0, err);
            break;
        case 13: /*  edns_version */
            in = cbor_parse_int(in, in_max, &edns_version, 0, err);
            break;
        case 14: /*  udp_buf_size */
            in = cbor_parse_int(in, in_max, &udp_buf_size, 0, err);
            break;
        case 15: /*  opt_rdata_index */
            in = cbor_parse_int(in, in_max, &opt_rdata_index, 0, err);
            break;
        case 16: /*  response_rcode */
            in = cbor_parse_int(in, in_max, &response_rcode, 0, err);
            break;
        default:
            in = cbor_skip(in, in_max, err);
            break;
        }
    }
    return in;
}